

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O1

void Js::AsmJsByteCodeDumper::Dump
               (FunctionBody *body,TypedRegisterAllocator *typedRegister,AsmJsFunc *asmFunc)

{
  int *this;
  code *pcVar1;
  byte *pbVar2;
  bool bVar3;
  Which WVar4;
  byte bVar5;
  OpCodeAsmJs op;
  uint32 uVar6;
  uint32 uVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  undefined4 *puVar11;
  byte *pbVar12;
  ByteBlock *this_00;
  char16_t *pcVar13;
  TypedRegisterAllocator *this_01;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int i;
  uint i_00;
  undefined1 auStack_d8 [8];
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  statementReader;
  ByteCodeReader reader;
  ulong local_80;
  ulong local_78;
  LayoutSize local_68;
  uint local_64;
  AsmJsVarType var;
  uint local_5c;
  uint local_58;
  ulong local_48;
  ulong local_40;
  AsmJsVarType local_31;
  
  ByteCodeReader::Create((ByteCodeReader *)&statementReader.m_statementIndex,body,0);
  auStack_d8 = (undefined1  [8])0x0;
  statementReader.m_startLocation = (byte *)0x0;
  statementReader.m_statementMap._0_4_ = 0xffffffff;
  statementReader._12_8_ = 0;
  statementReader.m_statementMapIter.accumulatedSourceBegin = 0;
  statementReader.m_statementMapIter.accumulatedBytecodeBegin = 0;
  statementReader.m_statementMapIter.indexOfActualOffset = 0;
  statementReader.m_fullstatementMap._0_4_ = 0;
  statementReader.m_fullstatementMap._4_4_ = 0;
  statementReader.m_nextStatementBoundary._0_4_ = 0;
  statementReader.m_nextStatementBoundary._4_1_ = 1;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::Create((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            *)auStack_d8,body,0);
  FunctionBody::DumpFullFunctionName(body);
  Output::Print(L" Asm.js (");
  pvVar10 = FunctionProxy::GetAuxPtr((FunctionProxy *)body,AsmJsFunctionInfo);
  uVar15 = (ulong)*(ushort *)((long)pvVar10 + 100);
  if (uVar15 != 0) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar16 = 0;
    do {
      if (*(short *)((long)pvVar10 + 100) == -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                    ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                    "mArgCount != Constants::InvalidArgSlot");
        if (!bVar3) goto LAB_007db05b;
        *puVar11 = 0;
      }
      if (*(ushort *)((long)pvVar10 + 100) <= uVar16) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                    ,0x3b9,"(index < mArgCount)","index < mArgCount");
        if (!bVar3) goto LAB_007db05b;
        *puVar11 = 0;
      }
      AsmJsVarType::AsmJsVarType
                ((AsmJsVarType *)&local_68,*(Which *)(*(long *)((long)pvVar10 + 0x68) + uVar16));
      if (uVar16 != 0) {
        Output::Print(L", ");
      }
      switch((undefined1)local_68) {
      case 0:
        pcVar13 = L"In%hu|0";
        break;
      case 1:
        pcVar13 = L"int64(In%hu)";
        break;
      case 2:
        pcVar13 = L"+In%hu";
        break;
      case 3:
        pcVar13 = L"flt(In%hu)";
        break;
      default:
        if ((byte)((undefined1)local_68 - Int32x4) < 0xb) {
          WVar4 = AsmJsVarType::which((AsmJsVarType *)&local_68);
          switch(WVar4) {
          case Int32x4:
            pcVar13 = L"I4(In%hu)";
            break;
          default:
            goto switchD_007daa20_caseD_f;
          case Int8x16:
            pcVar13 = L"I16(In%hu)";
            break;
          case Float32x4:
            pcVar13 = L"F4(In%hu)";
            break;
          case Float64x2:
            pcVar13 = L"D2(In%hu)";
            break;
          case Int64x2:
            pcVar13 = L"I2(In%hu)";
          }
          break;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                    ,0x47,"((0))","UNREACHED");
        if (bVar3) {
          *puVar11 = 0;
          goto switchD_007daa20_caseD_f;
        }
        goto LAB_007db05b;
      }
      Output::Print(pcVar13,uVar16 & 0xffffffff);
switchD_007daa20_caseD_f:
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  Output::Print(L") ");
  uVar6 = FunctionBody::GetCountField(body,ByteCodeCount);
  uVar7 = FunctionBody::GetCountField(body,ByteCodeWithoutLDACount);
  Output::Print(L"(size: %d [%d])\n",(ulong)uVar6,(ulong)uVar7);
  this_01 = &asmFunc->mTypedRegisterAllocator;
  if (asmFunc == (AsmJsFunc *)0x0) {
    this_01 = typedRegister;
  }
  if (typedRegister != (TypedRegisterAllocator *)0x0) {
    this_01 = typedRegister;
  }
  if (this_01 != (TypedRegisterAllocator *)0x0) {
    WAsmJs::TypedRegisterAllocator::DumpLocalsInfo(this_01);
  }
  if (asmFunc != (AsmJsFunc *)0x0) {
    DumpConstants(asmFunc,body);
  }
  if (this_01 != (TypedRegisterAllocator *)0x0) {
    Output::Print(L"    Implicit Arg Ins:\n    ======== =====\n    ");
    WAsmJs::TypedRegisterAllocator::GetArgumentStartIndex(this_01,&local_68);
    if (uVar15 != 0) {
      local_78 = (ulong)local_58;
      local_48 = (ulong)_var;
      local_40 = (ulong)local_5c;
      local_80 = (ulong)local_68;
      reader.m_endLocation = (byte *)(ulong)local_64;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar16 = 0;
      do {
        if (*(short *)((long)pvVar10 + 100) == -1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                      ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                      "mArgCount != Constants::InvalidArgSlot");
          if (!bVar3) goto LAB_007db05b;
          *puVar11 = 0;
        }
        if (*(ushort *)((long)pvVar10 + 100) <= uVar16) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                      ,0x3b9,"(index < mArgCount)","index < mArgCount");
          if (!bVar3) goto LAB_007db05b;
          *puVar11 = 0;
        }
        AsmJsVarType::AsmJsVarType(&local_31,*(Which *)(*(long *)((long)pvVar10 + 0x68) + uVar16));
        switch(local_31.which_) {
        case Int:
          Output::Print(L" I%d  In%d",local_80,uVar16 & 0xffffffff);
          local_80 = (ulong)((int)local_80 + 1);
          break;
        case Int64:
          Output::Print(L" L%d  In%d",reader.m_endLocation,uVar16 & 0xffffffff);
          reader.m_endLocation = (byte *)(ulong)((int)reader.m_endLocation + 1);
          break;
        case Double:
          Output::Print(L" D%d  In%d",local_40,uVar16 & 0xffffffff);
          local_40 = (ulong)((int)local_40 + 1);
          break;
        case Float:
          Output::Print(L" F%d  In%d",local_48,uVar16 & 0xffffffff);
          local_48 = (ulong)((int)local_48 + 1);
          break;
        default:
          if ((byte)(local_31.which_ - Int32x4) < 0xb) {
            Output::Print(L" SIMD%d  In%d",local_78,uVar16 & 0xffffffff);
            local_78 = (ulong)((int)local_78 + 1);
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                        ,0x80,"((0))","UNREACHED");
            if (!bVar3) goto LAB_007db05b;
            *puVar11 = 0;
          }
        }
        Output::Print(L"\n    ");
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    Output::Print(L"\n");
  }
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  this = &statementReader.m_statementIndex;
  uVar6 = 0;
  do {
    pbVar2 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                              statementReader.m_fullstatementMap._0_4_);
    pbVar12 = ByteCodeReader::GetIP((ByteCodeReader *)this);
    if (pbVar2 == pbVar12) {
      do {
        FunctionBody::PrintStatementSourceLine(body,uVar6);
        uVar6 = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                ::MoveNextStatementBoundary
                          ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                            *)auStack_d8);
        pbVar2 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                                  statementReader.m_fullstatementMap._0_4_);
        pbVar12 = ByteCodeReader::GetIP((ByteCodeReader *)this);
      } while (pbVar2 == pbVar12);
    }
    uVar8 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
    op = ByteCodeReader::ReadAsmJsOp((ByteCodeReader *)this,&local_68);
    if (op == EndOfBlock) {
      uVar8 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
      this_00 = FunctionBody::GetByteCode(body);
      uVar9 = ByteBlock::GetLength(this_00);
      if (uVar8 != uVar9) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                    ,0x94,
                                    "(reader.GetCurrentOffset() == body->GetByteCode()->GetLength())"
                                    ,"reader.GetCurrentOffset() == body->GetByteCode()->GetLength()"
                                   );
        if (!bVar3) goto LAB_007db05b;
        *puVar11 = 0;
      }
    }
    else {
      pcVar13 = L"";
      if (local_68 == MediumLayout) {
        pcVar13 = L"M-";
      }
      if (local_68 == LargeLayout) {
        pcVar13 = L"L-";
      }
      Output::Print(L"    %04x %2s",(ulong)uVar8,pcVar13);
      DumpOp(op,local_68,(ByteCodeReader *)this,body);
      if (DAT_015d346a == '\x01') {
        i_00 = uVar8 + 2;
        uVar9 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
        Output::SkipToColumn(0x46);
        if (local_68 == SmallLayout) {
LAB_007daf74:
          if (MaxByteSizedOpcodes < op) {
            uVar15 = 1;
            goto LAB_007daf89;
          }
          Output::Print(L"   ");
          i_00 = uVar8 + 1;
        }
        else {
          if (local_68 == MediumLayout) {
            iVar14 = 2;
          }
          else {
            if (local_68 != LargeLayout) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar11 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                          ,0xac,"(layoutSize == SmallLayout)",
                                          "layoutSize == SmallLayout");
              if (bVar3) {
                *puVar11 = 0;
                goto LAB_007daf74;
              }
LAB_007db05b:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            iVar14 = 4;
          }
          uVar15 = (ulong)((iVar14 + 1) - (uint)(op < InvalidOpCode));
LAB_007daf89:
          Output::Print(L"%02X ",uVar15);
        }
        Output::Print(L"%02x",(ulong)op & 0xff);
        if ((int)i_00 < (int)uVar9) {
          do {
            bVar5 = ByteCodeReader::GetRawByte((ByteCodeReader *)this,i_00);
            Output::Print(L" %02x",(ulong)bVar5);
            i_00 = i_00 + 1;
          } while (uVar9 != i_00);
        }
      }
      Output::Print(L"\n");
    }
    if (op == EndOfBlock) {
      pbVar2 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                                statementReader.m_fullstatementMap._0_4_);
      pbVar12 = ByteCodeReader::GetIP((ByteCodeReader *)&statementReader.m_statementIndex);
      if (pbVar2 == pbVar12) {
        FunctionBody::PrintStatementSourceLine(body,uVar6);
        StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
        ::MoveNextStatementBoundary
                  ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                    *)auStack_d8);
      }
      Output::Print(L"\n");
      Output::Flush();
      return;
    }
  } while( true );
}

Assistant:

void AsmJsByteCodeDumper::Dump(FunctionBody* body, const WAsmJs::TypedRegisterAllocator* typedRegister, AsmJsFunc* asmFunc)
    {
        ByteCodeReader reader;
        reader.Create(body);
        StatementReader<FunctionBody::StatementMapList> statementReader;
        statementReader.Create(body);
        body->DumpFullFunctionName();
        Output::Print(_u(" Asm.js ("));
        AsmJsFunctionInfo* funcInfo = body->GetAsmJsFunctionInfo();
        const ArgSlot argCount = funcInfo->GetArgCount();
        for (ArgSlot i = 0; i < argCount; i++)
        {
            AsmJsVarType var = funcInfo->GetArgType(i);
            if (i > 0)
            {
                Output::Print(_u(", "));
            }
            if (var.isDouble())
            {
                Output::Print(_u("+In%hu"), i);
            }
            else if (var.isFloat())
            {
                Output::Print(_u("flt(In%hu)"), i);
            }
            else if (var.isInt())
            {
                Output::Print(_u("In%hu|0"), i);
            }
            else if (var.isInt64())
            {
                Output::Print(_u("int64(In%hu)"), i);
            }
            else if (var.isSIMD())
            {
                switch (var.which())
                {
                case AsmJsType::Int32x4:
                    Output::Print(_u("I4(In%hu)"), i);
                    break;
                case AsmJsType::Int8x16:
                    Output::Print(_u("I16(In%hu)"), i);
                    break;
                case AsmJsType::Float32x4:
                    Output::Print(_u("F4(In%hu)"), i);
                    break;
                case AsmJsType::Float64x2:
                    Output::Print(_u("D2(In%hu)"), i);
                    break;
                case AsmJsType::Int64x2:
                    Output::Print(_u("I2(In%hu)"), i);
                    break;
                }
            }
            else
            {
                Assert(UNREACHED);
            }
        }

        Output::Print(_u(") "));
        Output::Print(_u("(size: %d [%d])\n"), body->GetByteCodeCount(), body->GetByteCodeWithoutLDACount());

        if (!typedRegister && asmFunc)
        {
            typedRegister = &asmFunc->GetTypedRegisterAllocator();
        }

        if (typedRegister)
        {
            typedRegister->DumpLocalsInfo();
        }

        if (asmFunc)
        {
            DumpConstants(asmFunc, body);
        }

        if (typedRegister)
        {
            Output::Print(_u("    Implicit Arg Ins:\n    ======== =====\n    "));
            uint32 iArgs[WAsmJs::LIMIT];
            typedRegister->GetArgumentStartIndex(iArgs);
            uint32 iArg = iArgs[WAsmJs::INT32];
            uint32 lArg = iArgs[WAsmJs::INT64];
            uint32 dArg = iArgs[WAsmJs::FLOAT64];
            uint32 fArg = iArgs[WAsmJs::FLOAT32];
            uint32 simdArg = iArgs[WAsmJs::SIMD];
            for (ArgSlot i = 0; i < argCount; i++)
            {
                AsmJsVarType var = funcInfo->GetArgType(i);
                if (var.isDouble())
                {
                    Output::Print(_u(" D%d  In%d"), dArg++, i);
                }
                else if (var.isFloat())
                {
                    Output::Print(_u(" F%d  In%d"), fArg++, i);
                }
                else if (var.isInt())
                {
                    Output::Print(_u(" I%d  In%d"), iArg++, i);
                }
                else if (var.isInt64())
                {
                    Output::Print(_u(" L%d  In%d"), lArg++, i);
                }
                else if (var.isSIMD())
                {
                    Output::Print(_u(" SIMD%d  In%d"), simdArg++, i);
                }
                else
                {
                    Assert(UNREACHED);
                }
                Output::Print(_u("\n    "));
            }
            Output::Print(_u("\n"));
        }

        uint32 statementIndex = 0;
        while (true)
        {
            while (statementReader.AtStatementBoundary(&reader))
            {
                body->PrintStatementSourceLine(statementIndex);
                statementIndex = statementReader.MoveNextStatementBoundary();
            }
            int byteOffset = reader.GetCurrentOffset();
            LayoutSize layoutSize;
            OpCodeAsmJs op = reader.ReadAsmJsOp(layoutSize);
            if (op == OpCodeAsmJs::EndOfBlock)
            {
                Assert(reader.GetCurrentOffset() == body->GetByteCode()->GetLength());
                break;
            }
            Output::Print(_u("    %04x %2s"), byteOffset, layoutSize == LargeLayout ? _u("L-") : layoutSize == MediumLayout ? _u("M-") : _u(""));
            DumpOp(op, layoutSize, reader, body);
            if (Js::Configuration::Global.flags.Verbose)
            {
                int layoutStart = byteOffset + 2; // Account for the prefix op
                int endByteOffset = reader.GetCurrentOffset();
                Output::SkipToColumn(70);
                if (layoutSize == LargeLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCodeAsmJs::MaxByteSizedOpcodes ?
                        Js::OpCodeAsmJs::ExtendedLargeLayoutPrefix : Js::OpCodeAsmJs::LargeLayoutPrefix);
                }
                else if (layoutSize == MediumLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCodeAsmJs::MaxByteSizedOpcodes ?
                        Js::OpCodeAsmJs::ExtendedMediumLayoutPrefix : Js::OpCodeAsmJs::MediumLayoutPrefix);
                }
                else
                {
                    Assert(layoutSize == SmallLayout);
                    if (op > Js::OpCodeAsmJs::MaxByteSizedOpcodes)
                    {
                        Output::Print(_u("%02X "), Js::OpCodeAsmJs::ExtendedOpcodePrefix);
                    }
                    else
                    {
                        Output::Print(_u("   "));
                        layoutStart--; // don't have a prefix
                    }
                }

                Output::Print(_u("%02x"), (byte)op);
                for (int i = layoutStart; i < endByteOffset; i++)
                {
                    Output::Print(_u(" %02x"), reader.GetRawByte(i));
                }
            }
            Output::Print(_u("\n"));
        }
        if (statementReader.AtStatementBoundary(&reader))
        {
            body->PrintStatementSourceLine(statementIndex);
            statementIndex = statementReader.MoveNextStatementBoundary();
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }